

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setStyle(QWidget *this,QStyle *style)

{
  long lVar1;
  bool bVar2;
  QStyleSheetStyle *pQVar3;
  QStyleSheetStyle *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  QStyleSheetStyle *styleSheetStyle;
  QWidgetPrivate *d;
  QApplication *in_stack_ffffffffffffff98;
  QWidgetPrivate *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte bVar4;
  byte bVar5;
  undefined1 in_stack_ffffffffffffffe7;
  QStyle *in_stack_ffffffffffffffe8;
  QWidgetPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x367d1f);
  setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  QWidgetPrivate::createExtra(in_stack_ffffffffffffffa0);
  pQVar3 = qt_styleSheet((QStyle *)0x367d56);
  if (pQVar3 == (QStyleSheetStyle *)0x0) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x367d91);
    ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x367d9d);
    pQVar3 = qt_styleSheet((QStyle *)0x367da5);
    bVar4 = 1;
    bVar5 = bVar4;
    if (pQVar3 == (QStyleSheetStyle *)0x0) {
      QCoreApplication::instance();
      QApplication::styleSheet(in_stack_ffffffffffffff98);
      bVar2 = QString::isEmpty((QString *)0x367dda);
      bVar4 = bVar2 ^ 0xff;
      bVar5 = bVar4;
      QString::~QString((QString *)0x367dfb);
    }
    if ((bVar4 & 1) == 0) {
      QWidgetPrivate::setStyle_helper
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7
                );
    }
    else {
      operator_new(0x60);
      QStyleSheetStyle::QStyleSheetStyle
                (in_RDI,(QStyle *)CONCAT17(bVar5,CONCAT16(bVar4,in_stack_ffffffffffffffa8)));
      QWidgetPrivate::setStyle_helper
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7
                );
    }
  }
  else {
    QStyleSheetStyle::ref((QStyleSheetStyle *)pQVar3);
    QWidgetPrivate::setStyle_helper
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setStyle(QStyle *style)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_SetStyle, style != nullptr);
    d->createExtra();
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle *styleSheetStyle = qt_styleSheet(style)) {
        //if for some reason someone try to set a QStyleSheetStyle, ref it
        //(this may happen for example in QButtonDialogBox which propagates its style)
        styleSheetStyle->ref();
        d->setStyle_helper(style, false);
    } else if (qt_styleSheet(d->extra->style) || !qApp->styleSheet().isEmpty()) {
        // if we have an application stylesheet or have a proxy already, propagate
        d->setStyle_helper(new QStyleSheetStyle(style), true);
    } else
#endif
        d->setStyle_helper(style, false);
}